

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float16 float16_div_mips64(float16 a,float16 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  FloatParts FVar12;
  FloatParts FVar13;
  FloatParts p;
  FloatParts b_00;
  
  FVar12._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar12.frac = (ulong)(a & 0x3ff);
  FVar12 = sf_canonicalize(FVar12,&float16_params,status);
  uVar10 = FVar12._8_8_;
  uVar8 = FVar12.frac;
  FVar13._8_8_ = (ulong)(b >> 10 & 0x1f) | (ulong)(b & 0x8000) << 0x19;
  FVar13.frac = (ulong)(b & 0x3ff);
  FVar13 = sf_canonicalize(FVar13,&float16_params,status);
  uVar5 = FVar13._8_8_;
  uVar11 = FVar13.frac;
  uVar6 = (uVar5 ^ uVar10) & 0x10000000000;
  uVar7 = FVar12._12_4_ & 0xff;
  uVar3 = FVar13._12_4_ & 0xff;
  if ((uVar7 == 2) && (uVar3 == 2)) {
    uVar5 = (ulong)((FVar12.exp - FVar13.exp) - (uint)(uVar8 < uVar11));
    lVar4 = 0;
    if (uVar11 <= uVar8) {
      lVar4 = uVar8 << 0x3f;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar11 * 2;
    auVar2._8_8_ = uVar8 >> (uVar11 <= uVar8);
    auVar2._0_8_ = lVar4;
    uVar8 = (ulong)(SUB168(auVar2 % auVar1,0) != 0) | SUB168(auVar2 / auVar1,0);
    uVar10 = uVar10 & 0xffff00ff00000000;
  }
  else {
    if (((uVar10 | uVar5) & 0xfc00000000) != 0) {
      b_00._8_8_ = uVar5 & 0xffffffffffff;
      b_00.frac = uVar11;
      p = pick_nan(FVar12,b_00,status);
      goto LAB_00870570;
    }
    if (((uVar10 >> 0x20 & 1) != 0) && (uVar7 == uVar3)) {
      status->float_exception_flags = status->float_exception_flags | 1;
      uVar9 = 0x2000000000000000;
      if (status->snan_bit_is_one != '\0') {
        uVar9 = 0x1fffffffffffffff;
      }
      p.exp = 0x7fffffff;
      p.cls = float_class_qnan;
      p.sign = false;
      p._14_2_ = 0;
      p.frac = uVar9;
      goto LAB_00870570;
    }
    if ((uVar10 >> 0x20 & 1) != 0) {
      uVar6 = uVar6 | uVar10 & 0xffff0003ffffffff;
      p.exp = (int)uVar6;
      p.cls = (char)(uVar6 >> 0x20);
      p.sign = (_Bool)(char)(uVar6 >> 0x28);
      p._14_2_ = (short)(uVar6 >> 0x30);
      p.frac = uVar8;
      goto LAB_00870570;
    }
    if (uVar3 == 3) {
      uVar11 = uVar10 & 0xffff0000ffffffff | uVar6 | 0x100000000;
      p.exp = (int)uVar11;
      p.cls = (char)(uVar11 >> 0x20);
      p.sign = (_Bool)(char)(uVar11 >> 0x28);
      p._14_2_ = (short)(uVar11 >> 0x30);
      p.frac = uVar8;
      goto LAB_00870570;
    }
    if (uVar3 != 1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x702,(char *)0x0);
    }
    status->float_exception_flags = status->float_exception_flags | 4;
    uVar10 = uVar10 & 0xffff0000ffffffff;
    uVar5 = 0x300000000;
  }
  uVar6 = uVar5 | uVar10 | uVar6;
  p.exp = (int)uVar6;
  p.cls = (char)(uVar6 >> 0x20);
  p.sign = (_Bool)(char)(uVar6 >> 0x28);
  p._14_2_ = (short)(uVar6 >> 0x30);
  p.frac = uVar8;
LAB_00870570:
  FVar12 = round_canonical(p,status,&float16_params);
  return (ushort)FVar12.frac & 0x3ff | (ushort)((FVar12.exp & 0x1fU) << 10) |
         (ushort)(FVar12._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 float16_div(float16 a, float16 b, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pr = div_floats(pa, pb, status);

    return float16_round_pack_canonical(pr, status);
}